

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O2

void __thiscall
chrono::viper::ViperLowerArm::ViperLowerArm
          (ViperLowerArm *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,int *side)

{
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ViperPart::ViperPart
            (&this->super_ViperPart,name,rel_pos,(shared_ptr<chrono::ChMaterialSurface> *)&_Stack_38
             ,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  (this->super_ViperPart)._vptr_ViperPart = (_func_int **)&PTR__ViperPart_001a0f90;
  if ((*side == 0) || (*side == 1)) {
    std::__cxx11::string::assign((char *)&(this->super_ViperPart).m_mesh_name);
  }
  (this->super_ViperPart).m_color.R = 0.7;
  (this->super_ViperPart).m_color.G = 0.4;
  (this->super_ViperPart).m_color.B = 0.4;
  ViperPart::CalcMassProperties(&this->super_ViperPart,4500.0);
  return;
}

Assistant:

ViperLowerArm::ViperLowerArm(const std::string& name,
                             const ChFrame<>& rel_pos,
                             std::shared_ptr<ChMaterialSurface> mat,
                             const int& side)
    : ViperPart(name, rel_pos, mat, false) {
    if (side == 0) {
        m_mesh_name = "viper_L_bt_sus";
    } else if (side == 1) {
        m_mesh_name = "viper_R_bt_sus";
    }

    m_color = ChColor(0.7f, 0.4f, 0.4f);
    CalcMassProperties(4500);
}